

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kdtree.h
# Opt level: O0

void __thiscall kdtree::vertex::vertex(vertex *this,vctr *_coord)

{
  pointer *ppfVar1;
  vector<float,_std::allocator<float>_> *in_RDI;
  vector<float,_std::allocator<float>_> *in_stack_00000028;
  vector<float,_std::allocator<float>_> *in_stack_00000030;
  vector<float,_std::allocator<float>_> *this_00;
  pointer *local_28;
  
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)0x15406d);
  this_00 = in_RDI + 1;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)0x154080);
  std::shared_ptr<kdtree::vertex>::shared_ptr((shared_ptr<kdtree::vertex> *)0x154093);
  ppfVar1 = &in_RDI[3].super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_finish;
  do {
    local_28 = ppfVar1;
    std::shared_ptr<kdtree::vertex>::shared_ptr((shared_ptr<kdtree::vertex> *)0x1540c1);
    ppfVar1 = local_28 + 2;
  } while (local_28 + 2 !=
           &in_RDI[4].super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage);
  std::vector<float,_std::allocator<float>_>::operator=(in_stack_00000030,in_stack_00000028);
  std::vector<float,_std::allocator<float>_>::size(in_RDI);
  std::vector<float,_std::allocator<float>_>::resize(this_00,(size_type)local_28);
  return;
}

Assistant:

vertex(const vctr& _coord)
        {
            coord=_coord;
            normal.resize(coord.size());
            return;
        }